

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_clampVecScalarScalar_vec4(ShaderEvalContext *c)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar1 = *(undefined1 (*) [16])c->in[0].m_data;
  fVar2 = c->in[1].m_data[0];
  fVar3 = c->in[2].m_data[1];
  auVar9._0_12_ = auVar1._4_12_;
  auVar9._12_4_ = auVar1._0_4_;
  auVar8._4_4_ = fVar3;
  auVar8._0_4_ = fVar3;
  auVar8._8_4_ = fVar3;
  auVar8._12_4_ = fVar3;
  auVar9 = minps(auVar8,auVar9);
  uVar4 = -(uint)(auVar1._4_4_ < fVar2);
  uVar5 = -(uint)(auVar1._8_4_ < fVar2);
  uVar6 = -(uint)(auVar1._12_4_ < fVar2);
  uVar7 = -(uint)(auVar1._0_4_ < fVar2);
  (c->color).m_data[0] = (float)(~uVar4 & auVar9._0_4_ | (uint)fVar2 & uVar4);
  (c->color).m_data[1] = (float)(~uVar5 & auVar9._4_4_ | (uint)fVar2 & uVar5);
  (c->color).m_data[2] = (float)(~uVar6 & auVar9._8_4_ | (uint)fVar2 & uVar6);
  (c->color).m_data[3] = (float)(~uVar7 & auVar9._12_4_ | (uint)fVar2 & uVar7);
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }